

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int remove_ext_list(nifti_image *nim,char **elist,int len)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *__ptr;
  ulong uVar9;
  long lVar10;
  nifti1_extension *pnVar11;
  char *__format;
  ulong uVar12;
  long lVar13;
  
  uVar8 = nim->num_ext;
  if ((int)uVar8 < len) {
    fprintf(_stderr,"** cannot remove %d exts from image \'%s\' with only %d\n",(ulong)(uint)len,
            nim->fname,(ulong)uVar8);
  }
  else {
    if (len < 1) {
      __format = "** REL: (%d) no extensions to remove?\n";
      uVar12 = (ulong)(uint)len;
    }
    else {
      iVar6 = atoi(*elist);
      if (iVar6 == -1) {
        if (1 < g_debug) {
          fprintf(_stderr,"+d removing ALL (%d) extensions from \'%s\'\n",(ulong)uVar8,nim->fname);
        }
        nifti_free_extensions(nim);
        return 0;
      }
      if (2 < g_debug) {
        fprintf(_stderr,"+d removing %d exts from \'%s\'\n",(ulong)(uint)len,nim->fname);
        uVar8 = nim->num_ext;
      }
      __ptr = calloc((long)(int)uVar8,4);
      if (__ptr != (void *)0x0) {
        uVar12 = 0;
        while ((uVar7 = atoi(elist[uVar12]), -1 < (int)uVar7 && ((int)uVar7 < (int)uVar8))) {
          if (*(int *)((long)__ptr + (ulong)uVar7 * 4) != 0) {
            fprintf(_stderr,"** ext #%d (= %d) is a duplicate",uVar12 & 0xffffffff,(ulong)uVar7);
            goto LAB_0010c1c7;
          }
          *(undefined4 *)((long)__ptr + (ulong)uVar7 * 4) = 1;
          uVar12 = uVar12 + 1;
          if ((uint)len == uVar12) {
            lVar13 = (ulong)uVar8 << 4;
            uVar12 = (ulong)uVar8;
            do {
              uVar1 = uVar12 - 1;
              if (*(int *)((long)__ptr + uVar12 * 4 + -4) != 0) {
                pnVar11 = nim->ext_list;
                if (2 < g_debug) {
                  disp_nifti1_extension("+d removing ext: ",pnVar11 + uVar1,-1);
                  pnVar11 = nim->ext_list;
                }
                if (pnVar11[uVar1].edata != (char *)0x0) {
                  free(pnVar11[uVar1].edata);
                }
                iVar6 = nim->num_ext;
                if ((long)uVar12 < (long)iVar6) {
                  uVar9 = uVar12 & 0xffffffff;
                  lVar10 = lVar13;
                  do {
                    puVar2 = (undefined8 *)((long)&nim->ext_list->esize + lVar10);
                    uVar5 = puVar2[1];
                    puVar3 = (undefined8 *)((long)&nim->ext_list[-1].esize + lVar10);
                    *puVar3 = *puVar2;
                    puVar3[1] = uVar5;
                    iVar6 = nim->num_ext;
                    lVar10 = lVar10 + 0x10;
                    uVar8 = (int)uVar9 + 1;
                    uVar9 = (ulong)uVar8;
                  } while ((int)uVar8 < iVar6);
                }
                uVar8 = iVar6 - 1;
                nim->num_ext = uVar8;
              }
              lVar13 = lVar13 + -0x10;
              bVar4 = 1 < (long)uVar12;
              uVar12 = uVar1;
            } while (bVar4);
            if (3 < g_debug) {
              fwrite("-d done removing extensions\n",0x1c,1,_stderr);
              uVar8 = nim->num_ext;
            }
            if (uVar8 == 0) {
              if (1 < g_debug) {
                remove_ext_list_cold_1();
              }
              free(nim->ext_list);
              nim->ext_list = (nifti1_extension *)0x0;
            }
            free(__ptr);
            return 0;
          }
        }
        fprintf(_stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",uVar12 & 0xffffffff,
                (ulong)uVar7,(ulong)(uVar8 - 1),nim->fname);
LAB_0010c1c7:
        free(__ptr);
        return -1;
      }
      __format = "** failed to alloc %d marks\n";
      uVar12 = (ulong)uVar8;
    }
    fprintf(_stderr,__format,uVar12);
  }
  return -1;
}

Assistant:

int remove_ext_list( nifti_image * nim, char ** elist, int len )
{
   int * marks;
   int   c, ec, extval;

   if( len > nim->num_ext ){
      fprintf(stderr, "** cannot remove %d exts from image '%s' with only %d\n",
              len, nim->fname, nim->num_ext);
      return -1;
   }

   if( len <= 0 ){
      fprintf(stderr,"** REL: (%d) no extensions to remove?\n",len);
      return -1;
   }

   extval = atoi(elist[0]);  /* check the first value */

   /* first special case, elist[0] == -1 */
   if( extval == -1 )
   {
      if( g_debug > 1 )
          fprintf(stderr,"+d removing ALL (%d) extensions from '%s'\n",
                  nim->num_ext, nim->fname );
      nifti_free_extensions(nim);
      return 0;
   }

   if( g_debug > 2 )
      fprintf(stderr,"+d removing %d exts from '%s'\n", len, nim->fname );

   if( ! (marks = (int *)calloc(nim->num_ext, sizeof(int))) ) {
      fprintf(stderr,"** failed to alloc %d marks\n",nim->num_ext);
      return -1;
   }

   /* mark all extensions for removal */
   for( ec = 0; ec < len; ec++ )
   {
      extval = atoi(elist[ec]);

      if( extval < 0 || extval >= nim->num_ext ){
         fprintf(stderr,"** ext #%d (= %d) is out of range [0,%d] for %s\n",
                 ec, extval, nim->num_ext-1, nim->fname);
         free(marks); return -1;
      }

      if( marks[extval] ){
         fprintf(stderr,"** ext #%d (= %d) is a duplicate", ec, extval);
         free(marks); return -1;
      }

      marks[extval]++;
   }

   /* now remove them - count from top down to do lazy programming */
   for( ec = nim->num_ext-1; ec >= 0; ec-- )
   {
      if( !marks[ec] ) continue;   /* do not delete this one */

      if( g_debug > 2 )
         disp_nifti1_extension("+d removing ext: ",nim->ext_list+ec,-1);

      /* delete this data, and shift the list down (yeah, inefficient) */
      if( nim->ext_list[ec].edata ) free( nim->ext_list[ec].edata );

      /* move anything above down one */
      for( c = ec+1; c < nim->num_ext; c++ )
         nim->ext_list[c-1] = nim->ext_list[c];

      nim->num_ext--;
   }

   if( g_debug > 3 ) fprintf(stderr,"-d done removing extensions\n");

   if( nim->num_ext == 0 ){  /* did we trash the only extension? */
      if( g_debug > 1 )
         fprintf(stderr,"-d removed ALL extensions from %s\n",nim->fname);
      free(nim->ext_list);
      nim->ext_list = NULL;
   }

   free(marks);
   return 0;
}